

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O0

void __thiscall QDnsLookupPrivate::~QDnsLookupPrivate(QDnsLookupPrivate *this)

{
  QDnsLookupPrivate *in_RDI;
  
  ~QDnsLookupPrivate(in_RDI);
  operator_delete(in_RDI,0x1b0);
  return;
}

Assistant:

QDnsLookupPrivate()
        : type(QDnsLookup::A)
        , port(0)
        , protocol(QDnsLookup::Standard)
    { }